

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.h
# Opt level: O0

double __thiscall libDAI::TProb<double>::maxVal(TProb<double> *this)

{
  size_t sVar1;
  const_reference pvVar2;
  vector<double,_std::allocator<double>_> *in_RDI;
  size_t i;
  double Z;
  undefined8 local_18;
  undefined8 local_10;
  
  local_10 = 0.0;
  local_18 = 0;
  while( true ) {
    sVar1 = size((TProb<double> *)0xb1d679);
    if (sVar1 <= local_18) break;
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI,local_18);
    if (local_10 < *pvVar2) {
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI,local_18);
      local_10 = *pvVar2;
    }
    local_18 = local_18 + 1;
  }
  return local_10;
}

Assistant:

T maxVal() const {
                T Z = 0.0;
                for( size_t i = 0; i < size(); i++ ) {
                    if( _p[i] > Z )
                        Z = _p[i];
                }
                return Z;
            }